

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O2

void __thiscall
OctreeTracer::create_main_graphics_pipeline
          (OctreeTracer *this,shared_ptr<myvk::RenderPass> *render_pass,uint32_t subpass)

{
  int iVar1;
  undefined4 extraout_var;
  initializer_list<VkPipelineShaderStageCreateInfo> __l;
  initializer_list<VkDynamicState> __l_00;
  allocator_type local_3d31;
  undefined1 local_3d30 [24];
  shared_ptr<myvk::ShaderModule> frag_shader_module;
  shared_ptr<myvk::ShaderModule> vert_shader_module;
  shared_ptr<myvk::Device> device;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  shader_stages;
  VkDynamicState local_3cc8 [2];
  undefined1 local_3cc0 [24];
  element_type *local_3ca8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3ca0;
  VkSpecializationInfo *local_3c98;
  undefined1 auStack_3c90 [16];
  VertexInputState local_3c80;
  InputAssemblyState local_3c18;
  VkStructureType local_3bf0;
  void *local_3be8;
  undefined8 uStack_3be0;
  bool local_3bd8;
  ViewportState local_3bd0;
  MultisampleState local_3b68;
  VkStructureType local_3b30;
  void *local_3b28;
  undefined8 uStack_3b20;
  undefined8 local_3b18;
  undefined8 uStack_3b10;
  undefined1 local_3b08 [32];
  undefined8 local_3ae8;
  undefined8 uStack_3ae0;
  undefined8 local_3ad8;
  undefined8 uStack_3ad0;
  bool local_3ac8;
  ColorBlendState local_3ac0;
  DynamicState local_3a68;
  uint32_t kOctreeTracerFragSpv [3713];
  
  memcpy(kOctreeTracerFragSpv,&DAT_00210ea0,0x3a04);
  iVar1 = (*(((render_pass->super___shared_ptr<myvk::RenderPass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             )->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  std::__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&device.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2> *)CONCAT44(extraout_var,iVar1))
  ;
  vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::ShaderModule::Create
            ((ShaderModule *)local_3cc0,
             (Ptr<Device> *)&device.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>,
             kQuadVertSpv,0x354);
  std::__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2> *)local_3cc0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3cc0 + 8));
  myvk::ShaderModule::Create((ShaderModule *)local_3cc0,&device,kOctreeTracerFragSpv,0x3a04);
  std::__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2> *)local_3cc0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3cc0 + 8));
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)local_3cc0,
             vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,VK_SHADER_STAGE_VERTEX_BIT,(VkSpecializationInfo *)0x0);
  myvk::ShaderModule::GetPipelineShaderStageCreateInfo
            ((VkPipelineShaderStageCreateInfo *)auStack_3c90,
             frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,VK_SHADER_STAGE_FRAGMENT_BIT,(VkSpecializationInfo *)0x0);
  __l._M_len = 2;
  __l._M_array = (iterator)local_3cc0;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector(&shader_stages,__l,(allocator_type *)local_3d30);
  local_3cc0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_3cc0._8_8_ = (element_type *)0x0;
  local_3cc0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3ca8 = (element_type *)0x0;
  _Stack_3ca0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_3c98 = (VkSpecializationInfo *)0x0;
  auStack_3c90._0_8_ = 0;
  auStack_3c90._8_4_ = 0.0;
  local_3c80.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c80.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c80.m_bindings.
  super__Vector_base<VkVertexInputBindingDescription,_std::allocator<VkVertexInputBindingDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c80.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c80.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c80.m_attributes.
  super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c80.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_3c80.m_create_info.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  local_3c80.m_enable = false;
  local_3c80.m_create_info.pNext = (void *)0x0;
  local_3c80.m_create_info.flags = 0;
  local_3c80.m_create_info.vertexBindingDescriptionCount = 0;
  local_3c80.m_create_info.pVertexBindingDescriptions._0_4_ = 0;
  local_3c80.m_create_info._28_8_ = 0;
  local_3c18.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_3c18.m_enable = false;
  local_3c18.m_create_info.primitiveRestartEnable = 0;
  local_3c18.m_create_info.pNext = (void *)0x0;
  local_3c18.m_create_info.flags = 0;
  local_3c18.m_create_info.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  local_3bf0 = VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO;
  local_3bd8 = false;
  local_3be8 = (void *)0x0;
  uStack_3be0._0_4_ = 0;
  uStack_3be0._4_4_ = 0;
  local_3bd0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3bd0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3bd0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3bd0.m_scissors.super__Vector_base<VkRect2D,_std::allocator<VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3bd0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3bd0.m_viewports.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3bd0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_3bd0.m_create_info.pScissors = (VkRect2D *)0x0;
  local_3bd0.m_enable = false;
  local_3bd0.m_create_info.pNext = (void *)0x0;
  local_3bd0.m_create_info.flags = 0;
  local_3bd0.m_create_info.viewportCount = 0;
  local_3bd0.m_create_info.pViewports._0_4_ = 0;
  local_3bd0.m_create_info._28_8_ = 0;
  local_3b68.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_3b68.m_create_info.alphaToCoverageEnable._0_1_ = 0;
  local_3b68._41_8_ = 0;
  local_3b68.m_create_info.sampleShadingEnable = 0;
  local_3b68.m_create_info.minSampleShading = 0.0;
  local_3b68.m_create_info.pSampleMask._0_1_ = 0;
  local_3b68.m_create_info.pSampleMask._1_7_ = 0;
  local_3b68.m_create_info.pNext = (void *)0x0;
  local_3b68.m_create_info.flags = 0;
  local_3b68.m_create_info.rasterizationSamples = 0;
  local_3b30 = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_3b28 = (void *)0x0;
  uStack_3b20._0_4_ = 0;
  uStack_3b20._4_4_ = 0;
  local_3b18._0_4_ = 0;
  local_3b18._4_4_ = VK_COMPARE_OP_NEVER;
  uStack_3b10._0_4_ = 0;
  uStack_3b10._4_4_ = 0;
  local_3b08._0_4_ = VK_STENCIL_OP_KEEP;
  local_3b08._4_4_ = VK_STENCIL_OP_KEEP;
  local_3b08._8_4_ = VK_STENCIL_OP_KEEP;
  local_3b08._12_4_ = VK_COMPARE_OP_NEVER;
  local_3b08._16_4_ = 0;
  local_3b08._20_4_ = 0;
  local_3b08._24_4_ = 0;
  local_3b08._28_4_ = VK_STENCIL_OP_KEEP;
  local_3ae8._0_4_ = VK_STENCIL_OP_KEEP;
  local_3ae8._4_4_ = VK_STENCIL_OP_KEEP;
  uStack_3ae0._0_4_ = VK_COMPARE_OP_NEVER;
  uStack_3ae0._4_4_ = 0;
  local_3ad8._0_4_ = 0;
  local_3ad8._4_4_ = 0;
  uStack_3ad0._0_4_ = 0.0;
  uStack_3ad0._4_4_ = 0.0;
  local_3ac8 = false;
  local_3ac0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3ac0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3ac0.m_color_blend_attachments.
  super__Vector_base<VkPipelineColorBlendAttachmentState,_std::allocator<VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3ac0.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_3ac0.m_enable = false;
  local_3ac0.m_create_info.blendConstants[0] = 0.0;
  local_3ac0.m_create_info.blendConstants[1] = 0.0;
  local_3ac0.m_create_info.blendConstants[2] = 0.0;
  local_3ac0.m_create_info.blendConstants[3] = 0.0;
  local_3ac0.m_create_info.logicOp = VK_LOGIC_OP_CLEAR;
  local_3ac0.m_create_info.attachmentCount = 0;
  local_3ac0.m_create_info.pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
  local_3ac0.m_create_info.pNext = (void *)0x0;
  local_3ac0.m_create_info.flags = 0;
  local_3ac0.m_create_info.logicOpEnable = 0;
  local_3a68.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3a68.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3a68.m_dynamic_states.super__Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3a68.m_create_info.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
  local_3a68.m_create_info.pDynamicStates._0_1_ = 0;
  local_3a68._49_8_ = 0;
  local_3a68.m_create_info.pNext = (void *)0x0;
  local_3a68.m_create_info.flags._0_1_ = 0;
  local_3a68.m_create_info._17_7_ = 0;
  myvk::GraphicsPipelineState::VertexInputState::Enable(&local_3c80);
  myvk::GraphicsPipelineState::InputAssemblyState::Enable
            (&local_3c18,VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,0);
  myvk::GraphicsPipelineState::ViewportState::Enable(&local_3bd0,1,1);
  myvk::GraphicsPipelineState::RasterizationState::Initialize
            ((RasterizationState *)local_3cc0,VK_POLYGON_MODE_FILL,VK_FRONT_FACE_COUNTER_CLOCKWISE,1
            );
  myvk::GraphicsPipelineState::MultisampleState::Enable(&local_3b68,VK_SAMPLE_COUNT_1_BIT);
  myvk::GraphicsPipelineState::ColorBlendState::Enable(&local_3ac0,1,0);
  local_3cc8[0] = VK_DYNAMIC_STATE_VIEWPORT;
  local_3cc8[1] = VK_DYNAMIC_STATE_SCISSOR;
  __l_00._M_len = 2;
  __l_00._M_array = local_3cc8;
  std::vector<VkDynamicState,_std::allocator<VkDynamicState>_>::vector
            ((vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_3d30,__l_00,
             &local_3d31);
  myvk::GraphicsPipelineState::DynamicState::Enable
            (&local_3a68,(vector<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_3d30);
  std::_Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_>::~_Vector_base
            ((_Vector_base<VkDynamicState,_std::allocator<VkDynamicState>_> *)local_3d30);
  myvk::GraphicsPipeline::Create
            ((GraphicsPipeline *)local_3d30,&this->m_main_pipeline_layout,render_pass,&shader_stages
             ,(GraphicsPipelineState *)local_3cc0,subpass);
  std::__shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_main_graphics_pipeline).
              super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2> *)local_3d30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d30 + 8));
  myvk::GraphicsPipelineState::~GraphicsPipelineState((GraphicsPipelineState *)local_3cc0);
  std::
  _Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~_Vector_base(&shader_stages.
                 super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&frag_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vert_shader_module.super___shared_ptr<myvk::ShaderModule,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&device.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void OctreeTracer::create_main_graphics_pipeline(const std::shared_ptr<myvk::RenderPass> &render_pass,
                                                 uint32_t subpass) {
	constexpr uint32_t kOctreeTracerFragSpv[] = {
#include "spirv/octree_tracer.frag.u32"
	};
	std::shared_ptr<myvk::Device> device = render_pass->GetDevicePtr();

	std::shared_ptr<myvk::ShaderModule> vert_shader_module, frag_shader_module;
	vert_shader_module = myvk::ShaderModule::Create(device, kQuadVertSpv, sizeof(kQuadVertSpv));
	frag_shader_module = myvk::ShaderModule::Create(device, kOctreeTracerFragSpv, sizeof(kOctreeTracerFragSpv));

	std::vector<VkPipelineShaderStageCreateInfo> shader_stages = {
	    vert_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_VERTEX_BIT),
	    frag_shader_module->GetPipelineShaderStageCreateInfo(VK_SHADER_STAGE_FRAGMENT_BIT)};

	myvk::GraphicsPipelineState pipeline_state = {};
	pipeline_state.m_vertex_input_state.Enable();
	pipeline_state.m_input_assembly_state.Enable(VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	pipeline_state.m_viewport_state.Enable(1, 1);
	pipeline_state.m_rasterization_state.Initialize(VK_POLYGON_MODE_FILL, VK_FRONT_FACE_COUNTER_CLOCKWISE,
	                                                VK_CULL_MODE_FRONT_BIT);
	pipeline_state.m_multisample_state.Enable(VK_SAMPLE_COUNT_1_BIT);
	pipeline_state.m_color_blend_state.Enable(1, VK_FALSE);
	pipeline_state.m_dynamic_state.Enable({VK_DYNAMIC_STATE_VIEWPORT, VK_DYNAMIC_STATE_SCISSOR});

	m_main_graphics_pipeline =
	    myvk::GraphicsPipeline::Create(m_main_pipeline_layout, render_pass, shader_stages, pipeline_state, subpass);
}